

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::showFinderMessages(UEFITool *this)

{
  QListWidgetItem *this_00;
  pointer ppVar1;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  messages;
  QArrayDataPointer<char> local_68;
  QVariant local_50;
  
  QListWidget::clear();
  if (this->ffsParser != (FfsParser *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::vector(&messages,&this->ffsFinder->messagesVector);
    for (ppVar1 = messages.
                  super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 != messages.
                  super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
      this_00 = (QListWidgetItem *)operator_new(0x28);
      QListWidgetItem::QListWidgetItem(this_00,(QString *)ppVar1,(QListWidget *)0x0,0);
      QByteArray::QByteArray((QByteArray *)&local_68,(char *)&ppVar1->second,0x18);
      QVariant::QVariant(&local_50,(QByteArray *)&local_68);
      (**(code **)(*(long *)this_00 + 0x20))(this_00,0x100,&local_50);
      QVariant::~QVariant(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      QListWidget::addItem(*(QListWidget **)(this->ui + 0x1b8),this_00);
    }
    QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
    QTabWidget::setCurrentIndex((int)*(undefined8 *)(this->ui + 0x150));
    QAbstractItemView::scrollToBottom();
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&messages);
  }
  return;
}

Assistant:

void UEFITool::showFinderMessages()
{
    ui->finderMessagesListWidget->clear();
    if (!ffsParser)
        return;
    
    std::vector<std::pair<QString, QModelIndex> > messages = ffsFinder->getMessages();
    
    for (const auto &msg : messages) {
        QListWidgetItem* item = new QListWidgetItem(msg.first, NULL, 0);
        item->setData(Qt::UserRole, QByteArray((const char*)&msg.second, sizeof(msg.second)));;
        ui->finderMessagesListWidget->addItem(item);
    }
    
    ui->messagesTabWidget->setTabEnabled(TAB_SEARCH, true);
    ui->messagesTabWidget->setCurrentIndex(TAB_SEARCH);
    ui->finderMessagesListWidget->scrollToBottom();
}